

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.hpp
# Opt level: O3

bool __thiscall
Diligent::DeviceObjectArchive::
LoadResourceCommonData<Diligent::DearchiverBase::PSOData<Diligent::GraphicsPipelineStateCreateInfo>>
          (DeviceObjectArchive *this,ResourceType Type,char *Name,
          PSOData<Diligent::GraphicsPipelineStateCreateInfo> *ResData)

{
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  PSOData<Diligent::GraphicsPipelineStateCreateInfo> *pPVar4;
  char (*Args_1) [40];
  char *Args_1_00;
  char (*in_R8) [32];
  char *__s2;
  string _msg;
  Serializer<(Diligent::SerializerMode)0> Ser;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  char *local_40;
  Serializer<(Diligent::SerializerMode)0> local_38;
  undefined7 uVar5;
  
  pPVar4 = ResData;
  local_60._0_4_ = Type;
  local_40 = Name;
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)(local_60 + 8),Name,false);
  cVar3 = std::
          _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,(key_type *)local_60);
  if (((Char *)local_60._8_8_ != (Char *)0x0) && ((long)local_50._M_allocated_capacity < 0)) {
    operator_delete__((void *)local_60._8_8_);
  }
  if (cVar3.
      super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
      ._M_cur != (__node_type *)0x0) {
    __s2 = *(char **)((long)cVar3.
                            super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                            ._M_cur + 0x10);
    uVar5 = (undefined7)((ulong)pPVar4 >> 8);
    Args_1 = (char (*) [40])CONCAT71(uVar5,__s2 != (char *)0x0);
    if (((Name == (char *)0x0) == (__s2 != (char *)0x0)) ||
       ((Args_1 = (char (*) [40])CONCAT71(uVar5,Name == (char *)0x0 || __s2 == (char *)0x0),
        Name != (char *)0x0 && __s2 != (char *)0x0 && (iVar2 = strcmp(Name,__s2), iVar2 != 0)))) {
      FormatString<char[26],char[40]>
                ((string *)local_60,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SafeStrEqual(Name, it->first.GetName())",Args_1);
      DebugAssertionFailed
                ((Char *)CONCAT44(local_60._4_4_,local_60._0_4_),"LoadResourceCommonData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectArchive.hpp"
                 ,0x106);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_60._4_4_,local_60._0_4_) != &local_50) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_60._4_4_,local_60._0_4_),
                        local_50._M_allocated_capacity + 1);
      }
      __s2 = *(char **)((long)cVar3.
                              super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                              ._M_cur + 0x10);
    }
    local_38.m_Start =
         *(TPointer *)
          ((long)cVar3.
                 super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                 ._M_cur + 0x28);
    Args_1_00 = *(char (*) [14])local_38.m_Start +
                *(long *)((long)cVar3.
                                super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                                ._M_cur + 0x30);
    local_38.m_End = (TPointer)Args_1_00;
    local_38.m_Ptr = local_38.m_Start;
    bVar1 = DearchiverBase::PSOData<Diligent::GraphicsPipelineStateCreateInfo>::Deserialize
                      (ResData,__s2,&local_38);
    if (local_38.m_Ptr != local_38.m_End) {
      FormatString<char[26],char[14]>
                ((string *)local_60,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x75166c
                 ,(char (*) [14])Args_1_00);
      DebugAssertionFailed
                ((Char *)CONCAT44(local_60._4_4_,local_60._0_4_),"LoadResourceCommonData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectArchive.hpp"
                 ,0x10d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_60._4_4_,local_60._0_4_) != &local_50) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_60._4_4_,local_60._0_4_),
                        local_50._M_allocated_capacity + 1);
      }
    }
    return bVar1;
  }
  FormatString<char[11],char_const*,char[32]>
            ((string *)local_60,(Diligent *)"Resource \'",(char (*) [11])&local_40,
             (char **)"\' is not present in the archive",in_R8);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(2,CONCAT44(local_60._4_4_,local_60._0_4_),0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_60._4_4_,local_60._0_4_) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_60._4_4_,local_60._0_4_),local_50._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool LoadResourceCommonData(ResourceType     Type,
                                const char*      Name,
                                ReourceDataType& ResData) const
    {
        auto it = m_NamedResources.find(NamedResourceKey{Type, Name});
        if (it == m_NamedResources.end())
        {
            LOG_ERROR_MESSAGE("Resource '", Name, "' is not present in the archive");
            return false;
        }
        VERIFY_EXPR(SafeStrEqual(Name, it->first.GetName()));
        // Use string copy from the map
        Name = it->first.GetName();

        Serializer<SerializerMode::Read> Ser{it->second.Common};

        auto Res = ResData.Deserialize(Name, Ser);
        VERIFY_EXPR(Ser.IsEnded());
        return Res;
    }